

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

string * utf8_character_abi_cxx11_(string *__return_storage_ptr__,uint codepoint)

{
  undefined1 uVar1;
  char sequence [5];
  uint local_10;
  undefined1 local_c;
  allocator<char> local_9;
  
  local_c = 0;
  local_10 = 0;
  uVar1 = (undefined1)codepoint;
  if (codepoint < 0x80) {
    local_10 = codepoint & 0xff;
  }
  else if (codepoint < 0x800) {
    local_10 = (ushort)(CONCAT11(uVar1,(char)(codepoint >> 6)) | 0xc0) & 0xffff3fff | 0x8000;
  }
  else if (codepoint < 0x10000) {
    local_10 = (CONCAT12(uVar1,CONCAT11((char)(codepoint >> 6),(char)(codepoint >> 0xc))) & 0xff3fff
               | 0x80e0) & 0xff3fffff | 0x800000;
  }
  else if (codepoint < 0x110000) {
    local_10 = CONCAT13(uVar1,CONCAT12((char)(codepoint >> 6),
                                       CONCAT11((char)(codepoint >> 0xc),(char)(codepoint >> 0x12)))
                       ) & 0x3f3f3fff | 0x808080f0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&local_10,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string utf8_character (unsigned int codepoint)
{
  char sequence[5] {};

  // 0xxxxxxx -> 0xxxxxxx
  if (codepoint < 0x80)
  {
    sequence[0] = codepoint;
  }

  // 00000yyy yyxxxxxx -> 110yyyyy 10xxxxxx
  else if (codepoint < 0x800)
  {
    sequence[0] = 0xC0 | (codepoint & 0x7C0) >> 6;
    sequence[1] = 0x80 | (codepoint & 0x3F);
  }

  // zzzzyyyy yyxxxxxx -> 1110zzzz 10yyyyyy 10xxxxxx
  else if (codepoint < 0x10000)
  {
    sequence[0] = 0xE0 | (codepoint & 0xF000) >> 12;
    sequence[1] = 0x80 | (codepoint & 0xFC0)  >> 6;
    sequence[2] = 0x80 | (codepoint & 0x3F);
  }

  // 000wwwzz zzzzyyyy yyxxxxxx -> 11110www 10zzzzzz 10yyyyyy 10xxxxxx
  else if (codepoint < 0x110000)
  {
    sequence[0] = 0xF0 | (codepoint & 0x1C0000) >> 18;
    sequence[1] = 0x80 | (codepoint & 0x03F000) >> 12;
    sequence[2] = 0x80 | (codepoint & 0x0FC0)   >> 6;
    sequence[3] = 0x80 | (codepoint & 0x3F);
  }

  return std::string (sequence);
}